

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

bool __thiscall
QCompletionEngine::lookupCache
          (QCompletionEngine *this,QString *part,QModelIndex *parent,QMatchData *m)

{
  long lVar1;
  bool bVar2;
  QMap<QString,_QMatchData> *this_00;
  QMatchData *in_RDI;
  long in_FS_OFFSET;
  CacheItem *map;
  const_iterator it;
  QString key;
  const_iterator cit;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  QMap<QModelIndex,_QMap<QString,_QMatchData>_> *in_stack_ffffffffffffff90;
  bool local_41;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QString::isEmpty((QString *)0xa6aa64);
  if (bVar2) {
    local_41 = false;
  }
  else {
    QMap<QModelIndex,_QMap<QString,_QMatchData>_>::find
              (in_stack_ffffffffffffff90,
               (QModelIndex *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    QMap<QModelIndex,_QMap<QString,_QMatchData>_>::end(in_stack_ffffffffffffff90);
    bVar2 = ::operator==((const_iterator *)in_RDI,
                         (const_iterator *)
                         CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    if (bVar2) {
      local_41 = false;
    }
    else {
      this_00 = QMap<QModelIndex,_QMap<QString,_QMatchData>_>::const_iterator::operator*
                          ((const_iterator *)0xa6aae9);
      if ((int)in_RDI[2].indices.vector.d.d[0xb].super_QArrayData.alloc == 0) {
        QString::toLower((QString *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      }
      else {
        QString::QString((QString *)in_RDI,
                         (QString *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      }
      QMap<QString,_QMatchData>::find
                (this_00,(QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      QMap<QString,_QMatchData>::end(this_00);
      local_41 = ::operator==((const_iterator *)in_RDI,
                              (const_iterator *)
                              CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      if (!local_41) {
        QMap<QString,_QMatchData>::const_iterator::value((const_iterator *)0xa6aba4);
        QMatchData::operator=
                  (in_RDI,(QMatchData *)
                          CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      }
      local_41 = !local_41;
      QString::~QString((QString *)0xa6abc8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_41;
}

Assistant:

bool QCompletionEngine::lookupCache(const QString &part, const QModelIndex &parent, QMatchData *m) const
{
    if (part.isEmpty())
        return false; // early out to avoid cache[parent] lookup costs

    const auto cit = cache.find(parent);
    if (cit == cache.end())
        return false;

    const CacheItem& map = *cit;

    const QString key = c->cs == Qt::CaseInsensitive ? part.toLower() : part;

    const auto it = map.find(key);
    if (it == map.end())
        return false;

    *m = it.value();
    return true;
}